

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side1_8d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  
  dVar9 = *p0;
  dVar28 = p0[1];
  dVar10 = dVar9 - *p1;
  dVar33 = dVar28 - p1[1];
  dVar1 = p0[2];
  dVar22 = dVar1 - p1[2];
  dVar2 = p0[3];
  dVar24 = dVar2 - p1[3];
  dVar3 = p0[4];
  dVar26 = dVar3 - p1[4];
  dVar15 = *p1 - dVar9;
  dVar34 = p1[1] - dVar28;
  dVar21 = p1[2] - dVar1;
  dVar19 = p1[3] - dVar2;
  dVar17 = p1[4] - dVar3;
  dVar4 = p0[5];
  dVar29 = dVar4 - p1[5];
  dVar18 = p1[5] - dVar4;
  dVar5 = p0[6];
  dVar31 = dVar5 - p1[6];
  dVar20 = p1[6] - dVar5;
  dVar6 = p0[7];
  dVar11 = dVar6 - p1[7];
  dVar8 = p1[7] - dVar6;
  dVar14 = ABS(dVar22);
  if (ABS(dVar22) <= ABS(dVar33)) {
    dVar14 = ABS(dVar33);
  }
  dVar13 = ABS(dVar15);
  if (dVar13 <= dVar14) {
    dVar13 = dVar14;
  }
  dVar16 = ABS(dVar10);
  dVar23 = dVar16;
  if (dVar16 <= dVar13) {
    dVar23 = dVar13;
  }
  dVar13 = ABS(dVar24);
  dVar12 = dVar13;
  if (dVar13 <= dVar23) {
    dVar12 = dVar23;
  }
  dVar23 = ABS(dVar26);
  dVar27 = dVar23;
  if (dVar23 <= dVar12) {
    dVar27 = dVar12;
  }
  dVar30 = ABS(dVar29);
  dVar12 = dVar30;
  if (dVar30 <= dVar27) {
    dVar12 = dVar27;
  }
  dVar32 = ABS(dVar31);
  dVar27 = dVar32;
  if (dVar32 <= dVar12) {
    dVar27 = dVar12;
  }
  dVar12 = ABS(dVar11);
  dVar25 = dVar12;
  if (dVar12 <= dVar27) {
    dVar25 = dVar27;
  }
  dVar27 = ABS(dVar34);
  if (dVar27 <= dVar25) {
    dVar27 = dVar25;
  }
  dVar25 = ABS(dVar21);
  if (dVar25 <= dVar27) {
    dVar25 = dVar27;
  }
  dVar27 = ABS(dVar19);
  if (dVar27 <= dVar25) {
    dVar27 = dVar25;
  }
  dVar25 = ABS(dVar17);
  if (dVar25 <= dVar27) {
    dVar25 = dVar27;
  }
  dVar27 = ABS(dVar18);
  if (dVar27 <= dVar25) {
    dVar27 = dVar25;
  }
  dVar25 = ABS(dVar20);
  if (dVar25 <= dVar27) {
    dVar25 = dVar27;
  }
  dVar27 = ABS(dVar8);
  if (dVar27 <= dVar25) {
    dVar27 = dVar25;
  }
  if (dVar16 <= dVar14) {
    dVar16 = dVar14;
  }
  if (dVar13 <= dVar16) {
    dVar13 = dVar16;
  }
  if (dVar23 <= dVar13) {
    dVar23 = dVar13;
  }
  if (dVar30 <= dVar23) {
    dVar30 = dVar23;
  }
  if (dVar32 <= dVar30) {
    dVar32 = dVar30;
  }
  if (dVar12 <= dVar32) {
    dVar12 = dVar32;
  }
  dVar14 = ABS(*q0 - dVar9);
  if (dVar14 <= dVar12) {
    dVar14 = dVar12;
  }
  dVar13 = ABS(q0[1] - dVar28);
  if (dVar13 <= dVar14) {
    dVar13 = dVar14;
  }
  dVar14 = ABS(q0[2] - dVar1);
  if (dVar14 <= dVar13) {
    dVar14 = dVar13;
  }
  dVar13 = ABS(q0[3] - dVar2);
  if (dVar13 <= dVar14) {
    dVar13 = dVar14;
  }
  dVar14 = ABS(q0[4] - dVar3);
  if (dVar14 <= dVar13) {
    dVar14 = dVar13;
  }
  dVar13 = ABS(q0[5] - dVar4);
  if (dVar13 <= dVar14) {
    dVar13 = dVar14;
  }
  dVar14 = ABS(q0[6] - dVar5);
  if (dVar14 <= dVar13) {
    dVar14 = dVar13;
  }
  dVar13 = ABS(q0[7] - dVar6);
  if (dVar13 <= dVar14) {
    dVar13 = dVar14;
  }
  dVar14 = dVar13;
  dVar16 = dVar27;
  if ((dVar27 <= dVar13) && (dVar14 = dVar27, dVar27 < dVar13)) {
    dVar16 = dVar13;
  }
  iVar7 = 0;
  if ((1.1554293109153009e-147 <= dVar14) && (iVar7 = 0, dVar16 <= 5.599361855444509e+101)) {
    dVar9 = dVar8 * (q0[7] - dVar6) +
            dVar20 * (q0[6] - dVar5) +
            dVar18 * (q0[5] - dVar4) +
            dVar17 * (q0[4] - dVar3) +
            dVar19 * (q0[3] - dVar2) +
            dVar21 * (q0[2] - dVar1) + dVar15 * (*q0 - dVar9) + dVar34 * (q0[1] - dVar28);
    dVar28 = dVar27 * dVar13 * 1.6667009016668223e-14;
    dVar9 = (dVar11 * dVar11 +
            dVar31 * dVar31 +
            dVar29 * dVar29 +
            dVar26 * dVar26 + dVar24 * dVar24 + dVar22 * dVar22 + dVar10 * dVar10 + dVar33 * dVar33)
            - (dVar9 + dVar9);
    iVar7 = 1;
    if ((dVar9 <= dVar28) && (iVar7 = 0, dVar9 < -dVar28)) {
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

inline int side1_8d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double p0_4_p1_4 = (p0[4] - p1[4]);
    double p0_5_p1_5 = (p0[5] - p1[5]);
    double p0_6_p1_6 = (p0[6] - p1[6]);
    double p0_7_p1_7 = (p0[7] - p1[7]);
    double r;
    r = (1 * ((((((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)) + (p0_4_p1_4 * p0_4_p1_4)) + (p0_5_p1_5 * p0_5_p1_5)) + (p0_6_p1_6 * p0_6_p1_6)) + (p0_7_p1_7 * p0_7_p1_7)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    r = (r - (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0_1_p1_1);
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p0_0_p1_0)) )
    {
        max1 = fabs(p0_0_p1_0);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p0_4_p1_4)) )
    {
        max1 = fabs(p0_4_p1_4);
    } 
    if( (max1 < fabs(p0_5_p1_5)) )
    {
        max1 = fabs(p0_5_p1_5);
    } 
    if( (max1 < fabs(p0_6_p1_6)) )
    {
        max1 = fabs(p0_6_p1_6);
    } 
    if( (max1 < fabs(p0_7_p1_7)) )
    {
        max1 = fabs(p0_7_p1_7);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_7_p0_7)) )
    {
        max1 = fabs(p1_7_p0_7);
    } 
    double max2 = fabs(p0_1_p1_1);
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_0_p1_0)) )
    {
        max2 = fabs(p0_0_p1_0);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(p0_4_p1_4)) )
    {
        max2 = fabs(p0_4_p1_4);
    } 
    if( (max2 < fabs(p0_5_p1_5)) )
    {
        max2 = fabs(p0_5_p1_5);
    } 
    if( (max2 < fabs(p0_6_p1_6)) )
    {
        max2 = fabs(p0_6_p1_6);
    } 
    if( (max2 < fabs(p0_7_p1_7)) )
    {
        max2 = fabs(p0_7_p1_7);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    if( (max2 < fabs(q0_7_p0_7)) )
    {
        max2 = fabs(q0_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (lower_bound_1 < 1.15542931091530087067e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66670090166682227006e-14 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}